

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_edit.cc
# Opt level: O0

void __thiscall leveldb::VersionEdit::EncodeTo(VersionEdit *this,string *dst)

{
  ulong uVar1;
  bool bVar2;
  size_type sVar3;
  string *in_RSI;
  long in_RDI;
  FileMetaData *f;
  size_t i_1;
  pair<int,_unsigned_long> *deleted_file_kvp;
  iterator __end1;
  iterator __begin1;
  DeletedFileSet *__range1;
  size_t i;
  string *in_stack_ffffffffffffff28;
  Slice *in_stack_ffffffffffffff30;
  string *in_stack_ffffffffffffff38;
  string *in_stack_ffffffffffffff40;
  ulong local_60;
  _Self local_50;
  _Self local_48;
  long local_40;
  Slice local_38;
  ulong local_28;
  string *local_10;
  
  local_10 = in_RSI;
  if ((*(byte *)(in_RDI + 0x40) & 1) != 0) {
    PutVarint32(in_stack_ffffffffffffff40,(uint32_t)((ulong)in_stack_ffffffffffffff38 >> 0x20));
    Slice::Slice(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    PutLengthPrefixedSlice(in_stack_ffffffffffffff40,(Slice *)in_stack_ffffffffffffff38);
  }
  if ((*(byte *)(in_RDI + 0x41) & 1) != 0) {
    PutVarint32(in_stack_ffffffffffffff40,(uint32_t)((ulong)in_stack_ffffffffffffff38 >> 0x20));
    PutVarint64(in_stack_ffffffffffffff40,(uint64_t)in_stack_ffffffffffffff38);
  }
  if ((*(byte *)(in_RDI + 0x42) & 1) != 0) {
    PutVarint32(in_stack_ffffffffffffff40,(uint32_t)((ulong)in_stack_ffffffffffffff38 >> 0x20));
    PutVarint64(in_stack_ffffffffffffff40,(uint64_t)in_stack_ffffffffffffff38);
  }
  if ((*(byte *)(in_RDI + 0x43) & 1) != 0) {
    PutVarint32(in_stack_ffffffffffffff40,(uint32_t)((ulong)in_stack_ffffffffffffff38 >> 0x20));
    PutVarint64(in_stack_ffffffffffffff40,(uint64_t)in_stack_ffffffffffffff38);
  }
  if ((*(byte *)(in_RDI + 0x44) & 1) != 0) {
    PutVarint32(in_stack_ffffffffffffff40,(uint32_t)((ulong)in_stack_ffffffffffffff38 >> 0x20));
    PutVarint64(in_stack_ffffffffffffff40,(uint64_t)in_stack_ffffffffffffff38);
  }
  local_28 = 0;
  while( true ) {
    uVar1 = local_28;
    sVar3 = std::
            vector<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
            ::size((vector<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
                    *)(in_RDI + 0x48));
    if (sVar3 <= uVar1) break;
    PutVarint32(in_stack_ffffffffffffff40,(uint32_t)((ulong)in_stack_ffffffffffffff38 >> 0x20));
    std::
    vector<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
    ::operator[]((vector<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
                  *)(in_RDI + 0x48),local_28);
    PutVarint32(in_stack_ffffffffffffff40,(uint32_t)((ulong)in_stack_ffffffffffffff38 >> 0x20));
    std::
    vector<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
    ::operator[]((vector<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
                  *)(in_RDI + 0x48),local_28);
    local_38 = InternalKey::Encode((InternalKey *)0x126f51);
    PutLengthPrefixedSlice(in_stack_ffffffffffffff40,(Slice *)in_stack_ffffffffffffff38);
    local_28 = local_28 + 1;
  }
  local_40 = in_RDI + 0x60;
  local_48._M_node =
       (_Base_ptr)
       std::
       set<std::pair<int,_unsigned_long>,_std::less<std::pair<int,_unsigned_long>_>,_std::allocator<std::pair<int,_unsigned_long>_>_>
       ::begin((set<std::pair<int,_unsigned_long>,_std::less<std::pair<int,_unsigned_long>_>,_std::allocator<std::pair<int,_unsigned_long>_>_>
                *)in_stack_ffffffffffffff28);
  local_50._M_node =
       (_Base_ptr)
       std::
       set<std::pair<int,_unsigned_long>,_std::less<std::pair<int,_unsigned_long>_>,_std::allocator<std::pair<int,_unsigned_long>_>_>
       ::end((set<std::pair<int,_unsigned_long>,_std::less<std::pair<int,_unsigned_long>_>,_std::allocator<std::pair<int,_unsigned_long>_>_>
              *)in_stack_ffffffffffffff28);
  while( true ) {
    bVar2 = std::operator!=(&local_48,&local_50);
    if (!bVar2) break;
    std::_Rb_tree_const_iterator<std::pair<int,_unsigned_long>_>::operator*
              ((_Rb_tree_const_iterator<std::pair<int,_unsigned_long>_> *)0x126fef);
    PutVarint32(in_stack_ffffffffffffff40,(uint32_t)((ulong)in_stack_ffffffffffffff38 >> 0x20));
    PutVarint32(in_stack_ffffffffffffff40,(uint32_t)((ulong)in_stack_ffffffffffffff38 >> 0x20));
    PutVarint64(in_stack_ffffffffffffff40,(uint64_t)in_stack_ffffffffffffff38);
    std::_Rb_tree_const_iterator<std::pair<int,_unsigned_long>_>::operator++
              ((_Rb_tree_const_iterator<std::pair<int,_unsigned_long>_> *)in_stack_ffffffffffffff30)
    ;
  }
  local_60 = 0;
  while( true ) {
    sVar3 = std::
            vector<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
            ::size((vector<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
                    *)(in_RDI + 0x90));
    if (sVar3 <= local_60) break;
    std::
    vector<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
    ::operator[]((vector<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
                  *)(in_RDI + 0x90),local_60);
    PutVarint32(in_stack_ffffffffffffff40,(uint32_t)((ulong)in_stack_ffffffffffffff38 >> 0x20));
    std::
    vector<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
    ::operator[]((vector<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
                  *)(in_RDI + 0x90),local_60);
    PutVarint32(in_stack_ffffffffffffff40,(uint32_t)((ulong)in_stack_ffffffffffffff38 >> 0x20));
    PutVarint64(in_stack_ffffffffffffff40,(uint64_t)in_stack_ffffffffffffff38);
    PutVarint64(in_stack_ffffffffffffff40,(uint64_t)in_stack_ffffffffffffff38);
    in_stack_ffffffffffffff38 = local_10;
    InternalKey::Encode((InternalKey *)0x127127);
    PutLengthPrefixedSlice(in_stack_ffffffffffffff40,(Slice *)in_stack_ffffffffffffff38);
    in_stack_ffffffffffffff40 = local_10;
    InternalKey::Encode((InternalKey *)0x12715b);
    PutLengthPrefixedSlice(in_stack_ffffffffffffff40,(Slice *)in_stack_ffffffffffffff38);
    local_60 = local_60 + 1;
  }
  return;
}

Assistant:

void VersionEdit::EncodeTo(std::string* dst) const {
  if (has_comparator_) {
    PutVarint32(dst, kComparator);
    PutLengthPrefixedSlice(dst, comparator_);
  }
  if (has_log_number_) {
    PutVarint32(dst, kLogNumber);
    PutVarint64(dst, log_number_);
  }
  if (has_prev_log_number_) {
    PutVarint32(dst, kPrevLogNumber);
    PutVarint64(dst, prev_log_number_);
  }
  if (has_next_file_number_) {
    PutVarint32(dst, kNextFileNumber);
    PutVarint64(dst, next_file_number_);
  }
  if (has_last_sequence_) {
    PutVarint32(dst, kLastSequence);
    PutVarint64(dst, last_sequence_);
  }

  for (size_t i = 0; i < compact_pointers_.size(); i++) {
    PutVarint32(dst, kCompactPointer);
    PutVarint32(dst, compact_pointers_[i].first);  // level
    PutLengthPrefixedSlice(dst, compact_pointers_[i].second.Encode());
  }

  for (const auto& deleted_file_kvp : deleted_files_) {
    PutVarint32(dst, kDeletedFile);
    PutVarint32(dst, deleted_file_kvp.first);   // level
    PutVarint64(dst, deleted_file_kvp.second);  // file number
  }

  for (size_t i = 0; i < new_files_.size(); i++) {
    const FileMetaData& f = new_files_[i].second;
    PutVarint32(dst, kNewFile);
    PutVarint32(dst, new_files_[i].first);  // level
    PutVarint64(dst, f.number);
    PutVarint64(dst, f.file_size);
    PutLengthPrefixedSlice(dst, f.smallest.Encode());
    PutLengthPrefixedSlice(dst, f.largest.Encode());
  }
}